

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_variance_sse2.c
# Opt level: O0

uint aom_highbd_8_mse16x16_sse2(uint8_t *src8,int src_stride,uint8_t *ref8,int ref_stride,uint *sse)

{
  undefined4 in_ECX;
  long in_RDX;
  uint *in_R8;
  uint16_t *ref;
  uint16_t *src;
  int sum;
  undefined4 in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffbc;
  uint32_t *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  
  highbd_8_variance_sse2
            ((uint16_t *)(in_RDX << 1),in_stack_ffffffffffffffbc,
             (uint16_t *)CONCAT44(in_stack_ffffffffffffffb4,0x10),0,0xaefdb0,
             (int)((ulong)&stack0xffffffffffffffd4 >> 0x20),in_stack_ffffffffffffffd0,(int *)in_R8,
             (high_variance_fn_t)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),(int)in_RDX);
  return *in_R8;
}

Assistant:

unsigned int aom_highbd_8_mse16x16_sse2(const uint8_t *src8, int src_stride,
                                        const uint8_t *ref8, int ref_stride,
                                        unsigned int *sse) {
  int sum;
  uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  uint16_t *ref = CONVERT_TO_SHORTPTR(ref8);
  highbd_8_variance_sse2(src, src_stride, ref, ref_stride, 16, 16, sse, &sum,
                         aom_highbd_calc16x16var_sse2, 16);
  return *sse;
}